

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectMesh(XFileParser *this,Mesh *pMesh)

{
  pointer paVar1;
  pointer pFVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Logger *this_00;
  char *pcVar6;
  uint a;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  aiVector3D aVar10;
  string objectName;
  string name;
  allocator<char> local_a1;
  vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_> *local_a0;
  ulong local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&local_70);
  uVar3 = ReadInt(this);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (&pMesh->mPositions,(ulong)uVar3);
  for (lVar7 = 0; (ulong)uVar3 * 0xc - lVar7 != 0; lVar7 = lVar7 + 0xc) {
    aVar10 = ReadVector3(this);
    paVar1 = (pMesh->mPositions).
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    *(long *)((long)&paVar1->x + lVar7) = aVar10._0_8_;
    *(float *)((long)&paVar1->z + lVar7) = aVar10.z;
  }
  uVar4 = ReadInt(this);
  local_a0 = &pMesh->mPosFaces;
  local_98 = (ulong)uVar4;
  std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::resize(local_a0,local_98);
  for (uVar8 = 0; uVar8 != local_98; uVar8 = uVar8 + 1) {
    uVar4 = ReadInt(this);
    pFVar2 = (local_a0->
             super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>)._M_impl.
             super__Vector_impl_data._M_start;
    while (bVar9 = uVar4 != 0, uVar4 = uVar4 - 1, bVar9) {
      uVar5 = ReadInt(this);
      if (uVar5 <= uVar3) {
        local_90._M_dataplus._M_p._0_4_ = uVar5;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&pFVar2[uVar8].mIndices,(uint *)&local_90);
      }
    }
    TestForSeparator(this);
  }
  do {
    GetNextToken_abi_cxx11_(&local_90,this);
    if (local_90._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Unexpected end of file while parsing mesh structure",&local_a1
                );
      ThrowException(this,&local_50);
    }
    bVar9 = std::operator==(&local_90,"}");
    if (bVar9) {
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      return;
    }
    bVar9 = std::operator==(&local_90,"MeshNormals");
    if (bVar9) {
      ParseDataObjectMeshNormals(this,pMesh);
    }
    else {
      bVar9 = std::operator==(&local_90,"MeshTextureCoords");
      if (bVar9) {
        ParseDataObjectMeshTextureCoords(this,pMesh);
      }
      else {
        bVar9 = std::operator==(&local_90,"MeshVertexColors");
        if (bVar9) {
          ParseDataObjectMeshVertexColors(this,pMesh);
        }
        else {
          bVar9 = std::operator==(&local_90,"MeshMaterialList");
          if (bVar9) {
            ParseDataObjectMeshMaterialList(this,pMesh);
          }
          else {
            bVar9 = std::operator==(&local_90,"VertexDuplicationIndices");
            if (bVar9) {
LAB_0054a924:
              ParseUnknownDataObject(this);
            }
            else {
              pcVar6 = "XSkinMeshHeader";
              bVar9 = std::operator==(&local_90,"XSkinMeshHeader");
              if (bVar9) {
                ParseDataObjectSkinMeshHeader(this,(Mesh *)pcVar6);
              }
              else {
                bVar9 = std::operator==(&local_90,"SkinWeights");
                if (!bVar9) {
                  this_00 = DefaultLogger::get();
                  Logger::warn(this_00,"Unknown data object in mesh in x file");
                  goto LAB_0054a924;
                }
                ParseDataObjectSkinWeights(this,pMesh);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_90);
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectMesh( Mesh* pMesh)
{
    std::string name;
    readHeadOfDataObject( &name);

    // read vertex count
    unsigned int numVertices = ReadInt();
    pMesh->mPositions.resize( numVertices);

    // read vertices
    for( unsigned int a = 0; a < numVertices; a++)
        pMesh->mPositions[a] = ReadVector3();

    // read position faces
    unsigned int numPosFaces = ReadInt();
    pMesh->mPosFaces.resize( numPosFaces);
    for( unsigned int a = 0; a < numPosFaces; ++a) {
        // read indices
        unsigned int numIndices = ReadInt();
        Face& face = pMesh->mPosFaces[a];
        for (unsigned int b = 0; b < numIndices; ++b) {
            const int idx( ReadInt() );
            if ( static_cast<unsigned int>( idx ) <= numVertices ) {
                face.mIndices.push_back( idx );
            }
        }
        TestForSeparator();
    }

    // here, other data objects may follow
    bool running = true;
    while ( running ) {
        std::string objectName = GetNextToken();

        if( objectName.empty() )
            ThrowException( "Unexpected end of file while parsing mesh structure");
        else
        if( objectName == "}")
            break; // mesh finished
        else
        if( objectName == "MeshNormals")
            ParseDataObjectMeshNormals( pMesh);
        else
        if( objectName == "MeshTextureCoords")
            ParseDataObjectMeshTextureCoords( pMesh);
        else
        if( objectName == "MeshVertexColors")
            ParseDataObjectMeshVertexColors( pMesh);
        else
        if( objectName == "MeshMaterialList")
            ParseDataObjectMeshMaterialList( pMesh);
        else
        if( objectName == "VertexDuplicationIndices")
            ParseUnknownDataObject(); // we'll ignore vertex duplication indices
        else
        if( objectName == "XSkinMeshHeader")
            ParseDataObjectSkinMeshHeader( pMesh);
        else
        if( objectName == "SkinWeights")
            ParseDataObjectSkinWeights( pMesh);
        else
        {
            ASSIMP_LOG_WARN("Unknown data object in mesh in x file");
            ParseUnknownDataObject();
        }
    }
}